

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

void gen_any_value_header(Am_Value *old_val,Am_Value_List *part_chain,Am_Slot_Key slot)

{
  bool bVar1;
  undefined6 in_register_00000012;
  char *value;
  
  if ((int)CONCAT62(in_register_00000012,slot) == 0x175) {
    value = "Any_Command_";
  }
  else if (old_val->type == 0xa001) {
    value = "Any_Object_";
  }
  else {
    bVar1 = Am_Inter_Location::Test(old_val);
    value = "Any_Value_";
    if (bVar1) {
      value = "Any_Location_";
    }
  }
  Am_Value_List::Add(part_chain,value,Am_TAIL,true);
  return;
}

Assistant:

void
gen_any_value_header(Am_Value &old_val, Am_Value_List &part_chain,
                     Am_Slot_Key slot)
{
  if (slot == Am_REGISTER_COMMAND) //then is the command part
    part_chain.Add("Any_Command_");
  else if (old_val.type == Am_OBJECT)
    part_chain.Add("Any_Object_");
  else if (Am_Inter_Location::Test(old_val))
    part_chain.Add("Any_Location_");
  else
    part_chain.Add("Any_Value_"); //hack
}